

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

bool SQLite::Database::isUnencrypted(string *aFilename)

{
  long lVar1;
  char cVar2;
  Exception *pEVar3;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  Exception exception_1;
  Exception exception;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char header [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (aFilename->_M_string_length == 0) {
    Exception::Exception(&exception,"Could not open database, the aFilename parameter was empty.");
    pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar3,&exception);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::ifstream::ifstream(&exception,(aFilename->_M_dataplus)._M_p,_S_in|_S_bin);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::operator+(&local_48,"Error opening file: ",aFilename);
      Exception::Exception(&exception_1,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(pEVar3,&exception_1);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pEVar3,&Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::istream::seekg((long)&exception,_S_beg);
      std::istream::getline((char *)&exception,(long)header);
      std::ifstream::close();
      auVar4[0] = -(header[0] == 'S');
      auVar4[1] = -(header[1] == 'Q');
      auVar4[2] = -(header[2] == 'L');
      auVar4[3] = -(header[3] == 'i');
      auVar4[4] = -(header[4] == 't');
      auVar4[5] = -(header[5] == 'e');
      auVar4[6] = -(header[6] == ' ');
      auVar4[7] = -(header[7] == 'f');
      auVar4[8] = -(header[8] == 'o');
      auVar4[9] = -(header[9] == 'r');
      auVar4[10] = -(header[10] == 'm');
      auVar4[0xb] = -(header[0xb] == 'a');
      auVar4[0xc] = -(header[0xc] == 't');
      auVar4[0xd] = -(header[0xd] == ' ');
      auVar4[0xe] = -(header[0xe] == '3');
      auVar4[0xf] = -(header[0xf] == '\0');
      std::ifstream::~ifstream(&exception);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

bool Database::isUnencrypted(const std::string& aFilename)
{
    if (aFilename.length() > 0) {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        char header[16];
        if (fileBuffer.is_open()) {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.getline(header, 16);
            fileBuffer.close();
        } else {
            const SQLite::Exception exception("Error opening file: " + aFilename);
            throw exception;
        }
        return strncmp(header, "SQLite format 3\000", 16) == 0;
    }
    const SQLite::Exception exception("Could not open database, the aFilename parameter was empty.");
    throw exception;
}